

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineInputFile::Data::prepFillList
          (Data *this,DeepFrameBuffer *fb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *fill)

{
  pointer pDVar1;
  Slice *pSVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  exr_attr_chlist_entry_t *peVar5;
  ostream *poVar6;
  char *pcVar7;
  ArgExc *pAVar8;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  pSVar2 = DeepFrameBuffer::getSampleCountSlice(fb);
  pDVar1 = (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar1) {
    (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)._M_impl.
    super__Vector_impl_data._M_finish = pDVar1;
  }
  if (pSVar2->base != (char *)0x0) {
    cVar3._M_node = (_Base_ptr)DeepFrameBuffer::begin(fb);
    do {
      CVar4 = DeepFrameBuffer::end(fb);
      if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
        return;
      }
      peVar5 = Context::findChannel(this->_ctxt,this->partNumber,(char *)(cVar3._M_node + 1));
      if (peVar5 == (exr_attr_chlist_entry_t *)0x0) {
        std::vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>::push_back
                  (fill,(value_type *)(cVar3._M_node + 9));
      }
      else if ((peVar5->x_sampling != cVar3._M_node[10]._M_color) ||
              (peVar5->y_sampling != *(int *)&cVar3._M_node[10].field_0x4)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar6 = std::operator<<(local_1a0,"X and/or y subsampling factors of \"");
        poVar6 = std::operator<<(poVar6,(char *)(cVar3._M_node + 1));
        poVar6 = std::operator<<(poVar6,"\" channel of input file \"");
        pcVar7 = Context::fileName(this->_ctxt);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::operator<<(poVar6,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar8,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
    } while( true );
  }
  pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar8,"Invalid base pointer, please set a proper sample count slice.");
  __cxa_throw(pAVar8,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void DeepScanLineInputFile::Data::prepFillList (
    const DeepFrameBuffer &fb, std::vector<DeepSlice> &fill)
{
    const Slice& sampleCountSlice = fb.getSampleCountSlice ();

    fill.clear ();

    if (!sampleCountSlice.base)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }

    for (DeepFrameBuffer::ConstIterator j = fb.begin (); j != fb.end (); ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt->findChannel (
            partNumber, j.name ());

        if (!curc)
        {
            fill.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << _ctxt->fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }
}